

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack16.h
# Opt level: O1

void ncnn::conv3x3s1_winograd63_transform_kernel_pack16_avx512
               (Mat *kernel,Mat *kernel_tm_pack16,int inch,int outch,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  undefined8 uVar3;
  void *pvVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int *piVar11;
  undefined1 auVar12 [64];
  long lVar13;
  long lVar14;
  _func_int ***ppp_Var15;
  int iVar16;
  long lVar17;
  undefined8 *puVar18;
  int i;
  long lVar19;
  _func_int ***ppp_Var20;
  int iVar21;
  Allocator *pAVar22;
  ulong uVar23;
  _func_int ***ppp_Var24;
  Allocator *pAVar25;
  _func_int ***ppp_Var26;
  ulong uVar27;
  long lVar28;
  Allocator *pAVar29;
  int j;
  long lVar30;
  long lVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  float tmp [8] [3];
  Mat local_e8;
  long local_a0;
  undefined1 local_98 [64];
  undefined1 local_58 [32];
  
  local_e8.cstep = 0;
  local_e8.data = (Allocator *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elempack = 0;
  local_e8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_e8.elemsize._4_4_ = (int)local_e8.refcount;
  local_e8.allocator = (Allocator *)local_e8.data;
  local_e8.dims = (int)local_e8.refcount;
  local_e8.w = local_e8.refcount._4_4_;
  local_e8.c = local_e8.elempack;
  Mat::create(&local_e8,0x40,inch,outch,4,(Allocator *)0x0);
  auVar12 = _DAT_0054eb40;
  if (0 < outch) {
    pvVar4 = kernel->data;
    auVar35 = vpermi2ps_avx512f(ZEXT3264(_DAT_0054fc40),_DAT_0054f480,_DAT_0054f4c0);
    auVar36 = vpermi2ps_avx512f(ZEXT3264(_DAT_0054fc60),_DAT_0054f480,_DAT_0054f4c0);
    auVar37 = vpermi2ps_avx512f(ZEXT3264(_DAT_0054fc80),_DAT_0054f480,_DAT_0054f4c0);
    uVar23 = 0;
    auVar43 = ZEXT3264(_DAT_0054fca0);
    pAVar29 = (Allocator *)local_e8.data;
    do {
      if (0 < inch) {
        iVar21 = inch * 9 * (int)uVar23;
        uVar27 = 0;
        pAVar22 = pAVar29;
        do {
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar27 * 0x24 + (long)iVar21 * 4);
          auVar32._4_4_ = uVar1;
          auVar32._0_4_ = uVar1;
          auVar32._8_4_ = uVar1;
          auVar32._12_4_ = uVar1;
          auVar32._16_4_ = uVar1;
          auVar32._20_4_ = uVar1;
          auVar32._24_4_ = uVar1;
          auVar32._28_4_ = uVar1;
          auVar40 = auVar35._0_32_;
          auVar32 = vmulps_avx512vl(auVar40,auVar32);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar27 * 0x24 + (long)iVar21 * 4 + 4);
          auVar33._4_4_ = uVar1;
          auVar33._0_4_ = uVar1;
          auVar33._8_4_ = uVar1;
          auVar33._12_4_ = uVar1;
          auVar33._16_4_ = uVar1;
          auVar33._20_4_ = uVar1;
          auVar33._24_4_ = uVar1;
          auVar33._28_4_ = uVar1;
          auVar41 = auVar36._0_32_;
          auVar32 = vfmadd231ps_avx512vl(auVar32,auVar41,auVar33);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar27 * 0x24 + (long)iVar21 * 4 + 8);
          auVar34._4_4_ = uVar1;
          auVar34._0_4_ = uVar1;
          auVar34._8_4_ = uVar1;
          auVar34._12_4_ = uVar1;
          auVar34._16_4_ = uVar1;
          auVar34._20_4_ = uVar1;
          auVar34._24_4_ = uVar1;
          auVar34._28_4_ = uVar1;
          auVar42 = auVar37._0_32_;
          auVar32 = vfmadd231ps_avx512vl(auVar32,auVar42,auVar34);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar27 * 0x24 + (long)iVar21 * 4 + 0xc);
          auVar7._4_4_ = uVar1;
          auVar7._0_4_ = uVar1;
          auVar7._8_4_ = uVar1;
          auVar7._12_4_ = uVar1;
          auVar7._16_4_ = uVar1;
          auVar7._20_4_ = uVar1;
          auVar7._24_4_ = uVar1;
          auVar7._28_4_ = uVar1;
          auVar33 = vmulps_avx512vl(auVar40,auVar7);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar27 * 0x24 + (long)iVar21 * 4 + 0x10);
          auVar8._4_4_ = uVar1;
          auVar8._0_4_ = uVar1;
          auVar8._8_4_ = uVar1;
          auVar8._12_4_ = uVar1;
          auVar8._16_4_ = uVar1;
          auVar8._20_4_ = uVar1;
          auVar8._24_4_ = uVar1;
          auVar8._28_4_ = uVar1;
          auVar33 = vfmadd231ps_avx512vl(auVar33,auVar41,auVar8);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar27 * 0x24 + (long)iVar21 * 4 + 0x14);
          auVar9._4_4_ = uVar1;
          auVar9._0_4_ = uVar1;
          auVar9._8_4_ = uVar1;
          auVar9._12_4_ = uVar1;
          auVar9._16_4_ = uVar1;
          auVar9._20_4_ = uVar1;
          auVar9._24_4_ = uVar1;
          auVar9._28_4_ = uVar1;
          auVar33 = vfmadd231ps_avx512vl(auVar33,auVar42,auVar9);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar27 * 0x24 + (long)iVar21 * 4 + 0x18);
          auVar10._4_4_ = uVar1;
          auVar10._0_4_ = uVar1;
          auVar10._8_4_ = uVar1;
          auVar10._12_4_ = uVar1;
          auVar10._16_4_ = uVar1;
          auVar10._20_4_ = uVar1;
          auVar10._24_4_ = uVar1;
          auVar10._28_4_ = uVar1;
          auVar34 = vmulps_avx512vl(auVar40,auVar10);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar27 * 0x24 + (long)iVar21 * 4 + 0x1c);
          auVar40._4_4_ = uVar1;
          auVar40._0_4_ = uVar1;
          auVar40._8_4_ = uVar1;
          auVar40._12_4_ = uVar1;
          auVar40._16_4_ = uVar1;
          auVar40._20_4_ = uVar1;
          auVar40._24_4_ = uVar1;
          auVar40._28_4_ = uVar1;
          auVar34 = vfmadd231ps_avx512vl(auVar34,auVar41,auVar40);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar27 * 0x24 + (long)iVar21 * 4 + 0x20);
          auVar41._4_4_ = uVar1;
          auVar41._0_4_ = uVar1;
          auVar41._8_4_ = uVar1;
          auVar41._12_4_ = uVar1;
          auVar41._16_4_ = uVar1;
          auVar41._20_4_ = uVar1;
          auVar41._24_4_ = uVar1;
          auVar41._28_4_ = uVar1;
          auVar34 = vfmadd231ps_avx512vl(auVar34,auVar42,auVar41);
          auVar38 = vinsertf64x4_avx512f(ZEXT3264(auVar32),auVar33,1);
          auVar39 = vpermt2ps_avx512f(auVar38,auVar43,ZEXT3264(auVar34));
          local_98 = vpermt2ps_avx512f(auVar38,auVar12,ZEXT3264(auVar34));
          local_58 = auVar39._0_32_;
          lVar30 = 0;
          pAVar25 = pAVar22;
          do {
            uVar2 = *(uint *)(local_98 + lVar30 * 0xc);
            uVar3 = *(undefined8 *)(local_98 + lVar30 * 0xc + 4);
            puVar18 = &DAT_0054f484;
            lVar19 = 0;
            do {
              auVar44._0_4_ = (float)*puVar18 * (float)uVar3;
              auVar44._4_4_ = (float)((ulong)*puVar18 >> 0x20) * (float)((ulong)uVar3 >> 0x20);
              auVar44._8_8_ = 0;
              auVar6 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar18 + -4)),auVar44,ZEXT416(uVar2)
                                      );
              auVar44 = vmovshdup_avx(auVar44);
              *(float *)((long)&pAVar25->_vptr_Allocator + lVar19 * 4) =
                   auVar6._0_4_ + auVar44._0_4_;
              lVar19 = lVar19 + 1;
              puVar18 = (undefined8 *)((long)puVar18 + 0xc);
            } while (lVar19 != 8);
            lVar30 = lVar30 + 1;
            pAVar25 = pAVar25 + 4;
          } while (lVar30 != 8);
          uVar27 = uVar27 + 1;
          pAVar22 = (Allocator *)
                    ((long)&pAVar22->_vptr_Allocator +
                    (long)local_e8.w *
                    CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
        } while (uVar27 != (uint)inch);
      }
      uVar23 = uVar23 + 1;
      pAVar29 = (Allocator *)
                ((long)&pAVar29->_vptr_Allocator +
                local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
    } while (uVar23 != (uint)outch);
  }
  iVar21 = inch + 0xf;
  if (-1 < inch) {
    iVar21 = inch;
  }
  iVar16 = outch + 0xf;
  if (-1 < outch) {
    iVar16 = outch;
  }
  Mat::create(kernel_tm_pack16,iVar21 >> 4,0x40,iVar16 >> 4,0x400,0x100,(Allocator *)0x0);
  if (0xf < outch) {
    iVar21 = kernel_tm_pack16->w;
    pvVar4 = kernel_tm_pack16->data;
    sVar5 = kernel_tm_pack16->elemsize;
    local_a0 = kernel_tm_pack16->cstep * sVar5;
    uVar23 = 0;
    do {
      lVar19 = local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
      ppp_Var20 = (_func_int ***)((long)(_func_int ***)local_e8.data + lVar19 * uVar23);
      lVar30 = (long)local_e8.w * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
      lVar31 = 0;
      do {
        if (0xf < inch) {
          lVar13 = (long)pvVar4 + (long)iVar21 * sVar5 * lVar31 + (uVar23 >> 4) * local_a0;
          ppp_Var24 = ppp_Var20;
          lVar28 = 0;
          do {
            lVar17 = 0;
            ppp_Var26 = ppp_Var24;
            do {
              lVar14 = lVar13;
              lVar13 = 0;
              ppp_Var15 = ppp_Var26;
              do {
                *(undefined4 *)(lVar14 + lVar13) = *(undefined4 *)ppp_Var15;
                ppp_Var15 = (_func_int ***)((long)ppp_Var15 + lVar19);
                lVar13 = lVar13 + 4;
              } while (lVar13 != 0x40);
              lVar17 = lVar17 + 1;
              ppp_Var26 = (_func_int ***)((long)ppp_Var26 + lVar30);
              lVar13 = lVar14 + 0x40;
            } while (lVar17 != 0x10);
            lVar17 = lVar28 + 0x1f;
            ppp_Var24 = ppp_Var24 + lVar30 * 2;
            lVar13 = lVar14 + 0x40;
            lVar28 = lVar28 + 0x10;
          } while (lVar17 < inch);
        }
        lVar31 = lVar31 + 1;
        ppp_Var20 = (_func_int ***)((long)ppp_Var20 + 4);
      } while (lVar31 != 0x40);
      uVar27 = uVar23 + 0x1f;
      uVar23 = uVar23 + 0x10;
    } while (uVar27 < (uint)outch);
  }
  piVar11 = (int *)CONCAT44(local_e8.refcount._4_4_,(int)local_e8.refcount);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_e8.data != (Allocator *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_kernel_pack16_avx512(const Mat& kernel, Mat& kernel_tm_pack16, int inch, int outch, const Option& opt)
{
    // winograd63 transform kernel
    Mat kernel_tm;
    kernel_tm.create(8 * 8, inch, outch);

    const float ktm[8][3] = {
        {1.0f, 0.0f, 0.0f},
        {-2.0f / 9, -2.0f / 9, -2.0f / 9},
        {-2.0f / 9, 2.0f / 9, -2.0f / 9},
        {1.0f / 90, 1.0f / 45, 2.0f / 45},
        {1.0f / 90, -1.0f / 45, 2.0f / 45},
        {1.0f / 45, 1.0f / 90, 1.0f / 180},
        {1.0f / 45, -1.0f / 90, 1.0f / 180},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel, transposed
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[8][3];
            for (int i = 0; i < 8; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // v
            for (int j = 0; j < 8; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 8; i++)
                {
                    kernel_tm0[j * 8 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }
    // interleave
    // src = 64-inch-outch
    // dst = 16b-16a-inch/16a-64-outch/16b
    kernel_tm_pack16.create(inch / 16, 64, outch / 16, (size_t)4u * 16 * 16, 16 * 16);
    for (int q = 0; q + 15 < outch; q += 16)
    {
        Mat g0 = kernel_tm_pack16.channel(q / 16);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p + 15 < inch; p += 16)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 16; j++)
                    {
                        const float* k00 = kernel_tm.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}